

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter anon_unknown.dwarf_a089a::findOrCreateFederateFilter(HelicsFederate fed,Filter *filter)

{
  int iVar1;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *puVar2;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  _Var3;
  FilterObject *pFVar4;
  __single_object filt;
  InterfaceHandle handle;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_48;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_40;
  int local_34;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = (filter->super_Interface).handle.hid;
  puVar2 = *(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> **)
            ((long)fed + 0xa0);
  local_34 = iVar1;
  _Var3 = std::
          upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>*,std::vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                    (*(undefined8 *)((long)fed + 0x98),puVar2);
  if ((_Var3._M_current == puVar2) ||
     (pFVar4 = ((_Var3._M_current)->_M_t).
               super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
               .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl,
     (pFVar4->filtPtr->super_Interface).handle.hid != iVar1)) {
    std::make_unique<helics::FilterObject>();
    (local_48._M_head_impl)->filtPtr = filter;
    (local_48._M_head_impl)->cloning = filter->cloning;
    getFedSharedPtr(&local_30,(HelicsError *)fed);
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_48._M_head_impl)->fedptr).
                super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    local_40._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::FilterObject,_std::default_delete<helics::FilterObject>,_true,_true>
          )(__uniq_ptr_data<helics::FilterObject,_std::default_delete<helics::FilterObject>,_true,_true>
            )local_48._M_head_impl;
    local_48._M_head_impl = (FilterObject *)0x0;
    pFVar4 = (FilterObject *)federateAddFilter(fed,&local_40);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               &local_48);
  }
  return pFVar4;
}

Assistant:

HelicsFilter findOrCreateFederateFilter(HelicsFederate fed, helics::Filter& filter)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = filter.getHandle();
    auto ind = std::upper_bound(fedObj->filters.begin(), fedObj->filters.end(), handle, filterSearch);
    if (ind != fedObj->filters.end() && (*ind)->filtPtr->getHandle() == handle) {
        HelicsFilter hfilt = ind->get();
        return hfilt;
    }

    auto filt = std::make_unique<helics::FilterObject>();
    filt->filtPtr = &filter;
    filt->cloning = filter.isCloningFilter();
    filt->fedptr = getFedSharedPtr(fed, nullptr);
    return federateAddFilter(fed, std::move(filt));
}